

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Chooser2.cxx
# Opt level: O2

void __thiscall Fl_File_Chooser::filter(Fl_File_Chooser *this,char *p)

{
  bool bVar1;
  char *__ptr;
  char *pcVar2;
  int dstsize;
  char cVar3;
  char *__s;
  char *pcVar4;
  char temp [2048];
  
  if ((p == (char *)0x0) || (*p == '\0')) {
    p = "*";
  }
  __ptr = strdup(p);
  Fl_Menu_::clear(&this->showChoice->super_Fl_Menu_);
  bVar1 = false;
  __s = __ptr;
  while ((__s != (char *)0x0 && (cVar3 = *__s, cVar3 != '\0'))) {
    pcVar2 = strchr(__s,9);
    if (pcVar2 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = pcVar2 + 1;
      *pcVar2 = '\0';
      cVar3 = *__s;
    }
    if ((cVar3 == '*') && (__s[1] == '\0')) {
      Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,all_files_label);
      bVar1 = true;
      __s = pcVar4;
    }
    else {
      quote_pathname(temp,__s,dstsize);
      Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,temp);
      pcVar2 = strstr(__s,"(*)");
      __s = pcVar4;
      if (pcVar2 != (char *)0x0) {
        bVar1 = true;
      }
    }
  }
  free(__ptr);
  if (!bVar1) {
    Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,all_files_label);
  }
  Fl_Menu_::add(&this->showChoice->super_Fl_Menu_,custom_filter_label);
  Fl_Choice::value(this->showChoice,0);
  showChoiceCB(this);
  return;
}

Assistant:

void
Fl_File_Chooser::filter(const char *p)		// I - Pattern(s)
{
  char		*copyp,				// Copy of pattern
		*start,				// Start of pattern
		*end;				// End of pattern
  int		allfiles;			// Do we have a "*" pattern?
  char		temp[FL_PATH_MAX];			// Temporary pattern string


  // Make sure we have a pattern...
  if (!p || !*p) p = "*";

  // Copy the pattern string...
  copyp = strdup(p);

  // Separate the pattern string as necessary...
  showChoice->clear();

  for (start = copyp, allfiles = 0; start && *start; start = end) {
    end = strchr(start, '\t');
    if (end) *end++ = '\0';

    if (strcmp(start, "*") == 0) {
      showChoice->add(all_files_label);
      allfiles = 1;
    } else {
      quote_pathname(temp, start, sizeof(temp));
      showChoice->add(temp);
      if (strstr(start, "(*)") != NULL) allfiles = 1;
    }
  }

  free(copyp);

  if (!allfiles) showChoice->add(all_files_label);

  showChoice->add(custom_filter_label);
  
  showChoice->value(0);
  showChoiceCB();
}